

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int cm_zlib_gzsetparams(gzFile file,int level,int strategy)

{
  int iVar1;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have != 0x79b1) {
    return -2;
  }
  if (*(int *)((long)&file[4].pos + 4) != 0) {
    return -2;
  }
  if (((int)file[3].pos == level) && (*(int *)((long)&file[3].pos + 4) == strategy)) {
    return 0;
  }
  if ((int)file[4].pos == 0) {
LAB_0067c1a0:
    if ((int)file[1].pos != 0) {
      if (((int)file[5].pos != 0) && (iVar1 = gz_comp((gz_statep)file,5), iVar1 == -1))
      goto LAB_0067c1dd;
      cm_zlib_deflateParams((z_streamp)&file[5].next,level,strategy);
    }
    *(int *)&file[3].pos = level;
    *(int *)((long)&file[3].pos + 4) = strategy;
    iVar1 = 0;
  }
  else {
    *(undefined4 *)&file[4].pos = 0;
    iVar1 = gz_zero((gz_statep)file,(off_t)file[4].next);
    if (iVar1 != -1) goto LAB_0067c1a0;
LAB_0067c1dd:
    iVar1 = *(int *)((long)&file[4].pos + 4);
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzsetparams(file, level, strategy)
    gzFile file;
    int level;
    int strategy;
{
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* if no change is requested, then do nothing */
    if (level == state->level && strategy == state->strategy)
        return Z_OK;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* change compression parameters for subsequent input */
    if (state->size) {
        /* flush previous input with previous parameters before changing */
        if (strm->avail_in && gz_comp(state, Z_BLOCK) == -1)
            return state->err;
        deflateParams(strm, level, strategy);
    }
    state->level = level;
    state->strategy = strategy;
    return Z_OK;
}